

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

wstring * ftxui::to_wstring(wstring *__return_storage_ptr__,string *s)

{
  bool bVar1;
  uint32_t local_2c;
  size_t sStack_28;
  uint32_t codepoint;
  size_t i;
  string *local_18;
  string *s_local;
  wstring *out;
  
  i._7_1_ = 0;
  local_18 = s;
  s_local = (string *)__return_storage_ptr__;
  std::__cxx11::wstring::wstring((wstring *)__return_storage_ptr__);
  sStack_28 = 0;
  local_2c = 0;
  while (bVar1 = EatCodePoint(local_18,sStack_28,&stack0xffffffffffffffd8,&local_2c), bVar1) {
    std::__cxx11::wstring::push_back((wchar_t)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring to_wstring(const std::string& s) {
  std::wstring out;

  size_t i = 0;
  uint32_t codepoint = 0;
  while (EatCodePoint(s, i, &i, &codepoint)) {
    // On linux wstring are UTF32 encoded:
    if constexpr (sizeof(wchar_t) == 4) {
      out.push_back(codepoint);  // NOLINT
      continue;
    }

    // On Windows, wstring are UTF16 encoded:

    // Codepoint encoded using 1 word:
    // NOLINTNEXTLINE
    if (codepoint < 0xD800 || (codepoint > 0xDFFF && codepoint < 0x10000)) {
      uint16_t p0 = codepoint;  // NOLINT
      out.push_back(p0);        // NOLINT
      continue;
    }

    // Codepoint encoded using 2 words:
    codepoint -= 0x010000;                               // NOLINT
    uint16_t p0 = (((codepoint << 12) >> 22) + 0xD800);  // NOLINT
    uint16_t p1 = (((codepoint << 22) >> 22) + 0xDC00);  // NOLINT
    out.push_back(p0);                                   // NOLINT
    out.push_back(p1);                                   // NOLINT
  }
  return out;
}